

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<float>::Subtract(TPZMatrix<float> *this,TPZMatrix<float> *A,TPZMatrix<float> *res)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  int64_t c;
  int64_t r;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float local_158 [38];
  TPZFMatrix<float> local_c0;
  
  if (((this->super_TPZBaseMatrix).fRow != (A->super_TPZBaseMatrix).fRow) ||
     ((this->super_TPZBaseMatrix).fCol != (A->super_TPZBaseMatrix).fCol)) {
    Error("Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>",(char *)0x0);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(this);
  iVar2 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4b])(A);
  if (CONCAT44(extraout_var,iVar1) == CONCAT44(extraout_var_00,iVar2)) {
    (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
    lVar3 = __dynamic_cast(res,&typeinfo,&TPZFMatrix<float>::typeinfo,0);
    if (lVar3 != 0) {
      lVar3 = __dynamic_cast(A,&typeinfo,&TPZFMatrix<float>::typeinfo,0);
      lVar4 = __dynamic_cast(this,&typeinfo,&TPZFMatrix<float>::typeinfo,0);
      if ((lVar4 == 0) || (lVar3 == 0)) {
        for (lVar3 = 0; lVar3 < (this->super_TPZBaseMatrix).fRow; lVar3 = lVar3 + 1) {
          for (lVar4 = 0; lVar4 < (this->super_TPZBaseMatrix).fCol; lVar4 = lVar4 + 1) {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar4)
            ;
            (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(A,lVar3,lVar4);
            local_158[0] = extraout_XMM0_Da - extraout_XMM0_Da_00;
            (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (res,lVar3,lVar4,local_158);
          }
        }
        return;
      }
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4a])(this,res,A);
    Storage(&local_c0,A);
    Storage((TPZFMatrixRef<float> *)local_158,res);
    TPZFMatrix<float>::operator-=((TPZFMatrix<float> *)local_158,&local_c0.super_TPZMatrix<float>);
    TPZFMatrixRef<float>::~TPZFMatrixRef((TPZFMatrixRef<float> *)local_158);
    TPZFMatrix<float>::~TPZFMatrix(&local_c0);
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "void TPZMatrix<float>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [TVar = float]"
                 );
  std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x698);
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}